

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglChooseConfigTests.cpp
# Opt level: O3

set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> * __thiscall
deqp::egl::(anonymous_namespace)::toSet<unsigned_int,2ul>
          (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,uint (*arr) [2])

{
  _Rb_tree_header *p_Var1;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar2;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  ::_M_insert_unique<unsigned_int_const&>
            ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
              *)__return_storage_ptr__,(uint *)this);
  pVar2 = std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)__return_storage_ptr__,(uint *)(this + 4));
  return (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
         pVar2.first._M_node._M_node;
}

Assistant:

std::set<T> toSet (const T (&arr)[N])
{
	std::set<T> set;
	for (size_t i = 0; i < N; i++)
		set.insert(arr[i]);
	return set;
}